

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

void __thiscall
nuraft::snapshot_sync_ctx::snapshot_sync_ctx
          (snapshot_sync_ctx *this,ptr<snapshot> *s,int peer_id,ulong timeout_ms,ulong offset)

{
  undefined4 in_EDX;
  timer_helper *in_RDI;
  long in_R8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *ms;
  size_t in_stack_ffffffffffffffc8;
  timer_helper *in_stack_ffffffffffffffd0;
  
  *(undefined4 *)
   &((__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)&in_RDI->t_created_)->_M_ptr =
       in_EDX;
  ms = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->duration_us_;
  std::shared_ptr<nuraft::snapshot>::shared_ptr
            ((shared_ptr<nuraft::snapshot> *)in_RDI,(shared_ptr<nuraft::snapshot> *)ms);
  (in_RDI->lock_).super___mutex_base._M_mutex.__align = in_R8;
  *(undefined8 *)((long)&(in_RDI->lock_).super___mutex_base._M_mutex + 8) = 0;
  timer_helper::timer_helper
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,SUB81((ulong)in_RDI >> 0x38,0));
  timer_helper::set_duration_ms(in_RDI,(size_t)ms);
  return;
}

Assistant:

snapshot_sync_ctx::snapshot_sync_ctx(const ptr<snapshot>& s,
                                     int peer_id,
                                     ulong timeout_ms,
                                     ulong offset)
    : peer_id_(peer_id)
    , snapshot_(s)
    , offset_(offset)
    , user_snp_ctx_(nullptr)
{
    // 10 seconds by default.
    timer_.set_duration_ms(timeout_ms);
}